

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_variant.h
# Opt level: O2

Impl<unsigned_short> * BamTools::Variant::CastFromBase<unsigned_short>(ImplBase *v)

{
  char cVar1;
  char *pcVar2;
  Impl<unsigned_short> *pIVar3;
  invalid_argument *this;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (v != (ImplBase *)0x0) {
    pIVar3 = (Impl<unsigned_short> *)
             __dynamic_cast(v,&ImplBase::typeinfo,&Impl<unsigned_short>::typeinfo,0);
    if (pIVar3 != (Impl<unsigned_short> *)0x0) {
      return pIVar3;
    }
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  pcVar2 = _endl<char,std::char_traits<char>>;
  cVar1 = *_endl<char,std::char_traits<char>>;
  std::__cxx11::string::string((string *)&local_58," is not a valid type",&local_59);
  std::operator+(&local_38,pcVar2 + (cVar1 == '*'),&local_58);
  std::invalid_argument::invalid_argument(this,(string *)&local_38);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

static Impl<T>* CastFromBase(ImplBase* v)
    {
        // This upcast will fail if T is other than the T used
        // with the constructor of variant_t.
        Impl<T>* p = dynamic_cast<Impl<T>*>(v);
        if (p == NULL)
            throw std::invalid_argument(typeid(T).name() + std::string(" is not a valid type"));
        return p;
    }